

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workitems.h
# Opt level: O0

void __thiscall
pbrt::MaterialEvalWorkItem<pbrt::CoatedConductorMaterial>::MaterialEvalWorkItem
          (MaterialEvalWorkItem<pbrt::CoatedConductorMaterial> *this,
          MaterialEvalWorkItem<pbrt::CoatedConductorMaterial> *param_2)

{
  MediumInterface *in_RSI;
  MediumInterface *in_RDI;
  
  memcpy(in_RDI,in_RSI,0xec);
  MediumInterface::MediumInterface(in_RSI,in_RDI);
  return;
}

Assistant:

GetNormalBumpEvalContext(Float dudx, Float dudy, Float dvdx,
                                                   Float dvdy) const {
        NormalBumpEvalContext ctx;
        ctx.p = Point3f(pi);
        ctx.uv = uv;
        ctx.dudx = dudx;
        ctx.dudy = dudy;
        ctx.dvdx = dvdx;
        ctx.dvdy = dvdy;
        ctx.shading.n = ns;
        ctx.shading.dpdu = dpdus;
        ctx.shading.dpdv = dpdvs;
        ctx.shading.dndu = dndus;
        ctx.shading.dndv = dndvs;
        ctx.faceIndex = faceIndex;
        return ctx;
    }